

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCommand.cxx
# Opt level: O0

bool anon_unknown.dwarf_bf7da7::HandleTouchImpl
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *args,bool create,cmExecutionStatus *status)

{
  bool bVar1;
  size_type sVar2;
  cmMakefile *pcVar3;
  string *a;
  undefined1 local_130 [8];
  string error;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  undefined1 local_e0 [8];
  string e;
  string local_b8;
  undefined1 local_88 [8];
  string tfile;
  string *arg;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __end1;
  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  __begin1;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  local_40;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *local_30;
  cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
  *__range1;
  cmExecutionStatus *status_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvStack_18;
  bool create_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  
  __range1 = (cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              *)status;
  status_local._7_1_ = create;
  pvStack_18 = args;
  sVar2 = std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size(args);
  if (sVar2 < 2) {
    __assert_fail("args.size() > 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmFileCommand.cxx"
                  ,0x38b,
                  "bool (anonymous namespace)::HandleTouchImpl(const std::vector<std::string> &, bool, cmExecutionStatus &)"
                 );
  }
  ___begin1 = cmMakeRange<std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        (pvStack_18);
  local_40 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::advance((cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                        *)&__begin1,1);
  local_30 = &local_40;
  __end1 = cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
           ::begin(local_30);
  arg = (string *)
        cmRange<__gnu_cxx::__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
        ::end(local_30);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&arg), bVar1) {
    tfile.field_2._8_8_ =
         __gnu_cxx::
         __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator*(&__end1);
    std::__cxx11::string::string((string *)local_88,(string *)tfile.field_2._8_8_);
    bVar1 = cmsys::SystemTools::FileIsFullPath((string *)local_88);
    if (!bVar1) {
      pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)__range1);
      a = cmMakefile::GetCurrentSourceDirectory_abi_cxx11_(pcVar3);
      e.field_2._M_local_buf[0xf] = '/';
      cmStrCat<std::__cxx11::string_const&,char,std::__cxx11::string_const&>
                (&local_b8,a,e.field_2._M_local_buf + 0xf,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 tfile.field_2._8_8_);
      std::__cxx11::string::operator=((string *)local_88,(string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_b8);
    }
    pcVar3 = cmExecutionStatus::GetMakefile((cmExecutionStatus *)__range1);
    bVar1 = cmMakefile::CanIWriteThisFile(pcVar3,(string *)local_88);
    if (bVar1) {
      register0x00000000 =
           cmsys::SystemTools::Touch((string *)local_88,(bool)(status_local._7_1_ & 1));
      bVar1 = cmsys::Status::operator_cast_to_bool((Status *)((long)&error.field_2 + 0xc));
      if (((bVar1 ^ 0xffU) & 1) == 0) {
        bVar1 = false;
      }
      else {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_130,"problem touching file: ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88
                      );
        cmExecutionStatus::SetError((cmExecutionStatus *)__range1,(string *)local_130);
        args_local._7_1_ = 0;
        bVar1 = true;
        std::__cxx11::string::~string((string *)local_130);
      }
    }
    else {
      std::operator+(&local_100,"attempted to touch a file: ",
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_88);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_e0,
                     &local_100," in a source directory.");
      std::__cxx11::string::~string((string *)&local_100);
      cmExecutionStatus::SetError((cmExecutionStatus *)__range1,(string *)local_e0);
      cmSystemTools::SetFatalErrorOccurred();
      args_local._7_1_ = 0;
      bVar1 = true;
      std::__cxx11::string::~string((string *)local_e0);
    }
    std::__cxx11::string::~string((string *)local_88);
    if (bVar1) goto LAB_00688fab;
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  args_local._7_1_ = 1;
LAB_00688fab:
  return (bool)(args_local._7_1_ & 1);
}

Assistant:

bool HandleTouchImpl(std::vector<std::string> const& args, bool create,
                     cmExecutionStatus& status)
{
  // File command has at least one argument
  assert(args.size() > 1);

  for (std::string const& arg :
       cmMakeRange(args).advance(1)) // Get rid of subcommand
  {
    std::string tfile = arg;
    if (!cmsys::SystemTools::FileIsFullPath(tfile)) {
      tfile =
        cmStrCat(status.GetMakefile().GetCurrentSourceDirectory(), '/', arg);
    }
    if (!status.GetMakefile().CanIWriteThisFile(tfile)) {
      std::string e =
        "attempted to touch a file: " + tfile + " in a source directory.";
      status.SetError(e);
      cmSystemTools::SetFatalErrorOccurred();
      return false;
    }
    if (!cmSystemTools::Touch(tfile, create)) {
      std::string error = "problem touching file: " + tfile;
      status.SetError(error);
      return false;
    }
  }
  return true;
}